

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O3

string * __thiscall
RigidBodyDynamics::Utils::print_hierarchy_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model,uint body_index,int indent)

{
  bool bVar1;
  char cVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  RBDLError *this_00;
  ulong uVar6;
  long lVar7;
  SpatialVector *extraout_RDX;
  SpatialVector *extraout_RDX_00;
  SpatialVector *extraout_RDX_01;
  SpatialVector *joint_dof;
  SpatialVector *extraout_RDX_02;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ostringstream errormsg;
  stringstream result;
  uint local_38c;
  string local_380;
  int local_35c;
  string *local_358;
  string local_350 [11];
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  uVar6 = (ulong)body_index;
  local_350[0]._M_dataplus._M_p = (pointer)&local_350[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"");
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_350,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350[0]._M_dataplus._M_p != &local_350[0].field_2) {
    operator_delete(local_350[0]._M_dataplus._M_p,local_350[0].field_2._M_allocated_capacity + 1);
  }
  uVar10 = (uint)uVar6;
  if (0 < (int)body_index) {
    uVar9 = body_index;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      uVar10 = (uint)uVar6;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  local_38c = (uint)model;
  get_body_name_abi_cxx11_(local_350,this,(Model *)((ulong)model & 0xffffffff),uVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_350[0]._M_dataplus._M_p,local_350[0]._M_string_length);
  joint_dof = extraout_RDX;
  local_358 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350[0]._M_dataplus._M_p != &local_350[0].field_2) {
    operator_delete(local_350[0]._M_dataplus._M_p,local_350[0].field_2._M_allocated_capacity + 1);
    joint_dof = extraout_RDX_00;
  }
  if (local_38c != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [ ",3);
    joint_dof = extraout_RDX_01;
  }
  uVar6 = (ulong)model & 0xffffffff;
  if (*(char *)(*(long *)(this + 0x338) + 0x68 + uVar6 * 0x70) == '\x01') {
    lVar5 = *(long *)(this + 0x30);
    do {
      lVar7 = *(long *)(lVar5 + 8 + uVar6 * 0x18);
      lVar5 = *(long *)(lVar5 + uVar6 * 0x18);
      local_38c = (uint)uVar6;
      if (lVar7 == lVar5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," end",4);
        joint_dof = extraout_RDX_02;
        break;
      }
      if (4 < (ulong)(lVar7 - lVar5)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
        poVar4 = std::endl<char,std::char_traits<char>>((ostream *)local_350);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Error: Cannot determine multi-dof joint as massless body with id ",0x41);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (name: ",8);
        Model::GetBodyName_abi_cxx11_(&local_380,(Model *)this,local_38c);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_380._M_dataplus._M_p,local_380._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") has more than one child:",0x1a)
        ;
        std::endl<char,std::char_traits<char>>(poVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        if (*(long *)(*(long *)(this + 0x30) + 8 + uVar6 * 0x18) !=
            *(long *)(*(long *)(this + 0x30) + uVar6 * 0x18)) {
          uVar10 = 1;
          uVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"  id: ",6);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_350);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," name: ",7);
            Model::GetBodyName_abi_cxx11_
                      (&local_380,(Model *)this,
                       *(uint *)(*(long *)(*(long *)(this + 0x30) + uVar6 * 0x18) + uVar8 * 4));
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,local_380._M_dataplus._M_p,local_380._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            uVar8 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar8 < (ulong)(*(long *)(*(long *)(this + 0x30) + 8 + uVar6 * 0x18) -
                                   *(long *)(*(long *)(this + 0x30) + uVar6 * 0x18) >> 2));
        }
        this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        Errors::RBDLError::RBDLError(this_00,&local_1d8);
        __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
      }
      get_dof_name_abi_cxx11_(local_350,(Utils *)(uVar6 * 0x30 + *(long *)(this + 0xb8)),joint_dof);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_350[0]._M_dataplus._M_p,
                          local_350[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350[0]._M_dataplus._M_p != &local_350[0].field_2) {
        operator_delete(local_350[0]._M_dataplus._M_p,local_350[0].field_2._M_allocated_capacity + 1
                       );
      }
      lVar5 = *(long *)(this + 0x30);
      local_38c = **(uint **)(lVar5 + uVar6 * 0x18);
      uVar6 = (ulong)local_38c;
      joint_dof = (SpatialVector *)(uVar6 * 0x70);
    } while (*(char *)((long)joint_dof[2].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array + *(long *)(this + 0x338) + 8) != '\0');
  }
  if (local_38c != 0) {
    get_dof_name_abi_cxx11_(local_350,(Utils *)(uVar6 * 0x30 + *(long *)(this + 0xb8)),joint_dof);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_350[0]._M_dataplus._M_p,
                        local_350[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ]",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350[0]._M_dataplus._M_p != &local_350[0].field_2) {
      operator_delete(local_350[0]._M_dataplus._M_p,local_350[0].field_2._M_allocated_capacity + 1);
    }
  }
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar5 = *(long *)(*(long *)(this + 0x30) + uVar6 * 0x18);
  if (*(long *)(*(long *)(this + 0x30) + 8 + uVar6 * 0x18) != lVar5) {
    uVar8 = 0;
    uVar11 = 1;
    do {
      print_hierarchy_abi_cxx11_
                (local_350,this,(Model *)(ulong)*(uint *)(lVar5 + uVar8 * 4),body_index + 1,indent);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_350[0]._M_dataplus._M_p,local_350[0]._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350[0]._M_dataplus._M_p != &local_350[0].field_2) {
        operator_delete(local_350[0]._M_dataplus._M_p,local_350[0].field_2._M_allocated_capacity + 1
                       );
      }
      lVar5 = *(long *)(*(long *)(this + 0x30) + uVar6 * 0x18);
      bVar1 = uVar11 < (ulong)(*(long *)(*(long *)(this + 0x30) + 8 + uVar6 * 0x18) - lVar5 >> 2);
      uVar8 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar1);
  }
  lVar5 = *(long *)(this + 0x318);
  lVar7 = *(long *)(this + 800);
  if (lVar7 != lVar5) {
    local_35c = body_index + 1;
    uVar6 = 0;
    do {
      if (*(uint *)(lVar5 + 0x68 + uVar6 * 0x130) == local_38c) {
        iVar12 = local_35c;
        if (-1 < (int)body_index) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        Model::GetBodyName_abi_cxx11_(local_350,(Model *)this,*(int *)(this + 0x330) + (int)uVar6);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_350[0]._M_dataplus._M_p,
                            local_350[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," [fixed]",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350[0]._M_dataplus._M_p != &local_350[0].field_2) {
          operator_delete(local_350[0]._M_dataplus._M_p,
                          local_350[0].field_2._M_allocated_capacity + 1);
        }
        lVar5 = *(long *)(this + 0x318);
        lVar7 = *(long *)(this + 800);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar8 = (lVar7 - lVar5 >> 4) * -0x79435e50d79435e5;
    } while (uVar6 <= uVar8 && uVar8 - uVar6 != 0);
  }
  psVar3 = local_358;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string print_hierarchy (const RigidBodyDynamics::Model &model,
                             unsigned int body_index = 0, int indent = 0)
{
  stringstream result ("");

  for (int j = 0; j < indent; j++) {
    result << "  ";
  }

  result << get_body_name (model, body_index);

  if (body_index > 0) {
    result << " [ ";
  }

  while (model.mBodies[body_index].mIsVirtual) {
    if (model.mu[body_index].size() == 0) {
      result << " end";
      break;
    } else if (model.mu[body_index].size() > 1) {
      std::ostringstream errormsg;
      errormsg << endl <<
               "Error: Cannot determine multi-dof joint as massless body with id " <<
               body_index << " (name: " << model.GetBodyName(body_index) <<
               ") has more than one child:" << endl;
      for (unsigned int ci = 0; ci < model.mu[body_index].size(); ci++) {
        errormsg << "  id: " << model.mu[body_index][ci] << " name: " <<
                 model.GetBodyName(model.mu[body_index][ci]) << endl;
      }
      throw Errors::RBDLError(errormsg.str());
    }

    result << get_dof_name(model.S[body_index]) << ", ";

    body_index = model.mu[body_index][0];
  }

  if (body_index > 0) {
    result << get_dof_name(model.S[body_index]) << " ]";
  }
  result << endl;

  unsigned int child_index = 0;
  for (child_index = 0; child_index < model.mu[body_index].size();
       child_index++) {
    result << print_hierarchy (model, model.mu[body_index][child_index],
                               indent + 1);
  }

  // print fixed children
  for (unsigned int fbody_index = 0; fbody_index < model.mFixedBodies.size();
       fbody_index++) {
    if (model.mFixedBodies[fbody_index].mMovableParent == body_index) {
      for (int j = 0; j < indent + 1; j++) {
        result << "  ";
      }

      result << model.GetBodyName(model.fixed_body_discriminator + fbody_index) <<
             " [fixed]" << endl;
    }
  }


  return result.str();
}